

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void __thiscall WindowHandleData::~WindowHandleData(WindowHandleData *this)

{
  thread *ptVar1;
  
  if ((this->w != 0) && (this->h != 0)) {
    free(this->bytes);
  }
  if (this->display != (Display *)0x0) {
    (*(this->im->f).destroy_image)(this->im);
    XFreePixmap(this->display,this->pix);
    XCloseDisplay(this->display);
  }
  std::condition_variable::~condition_variable(&this->cv);
  ptVar1 = (this->t)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t
           .super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar1 != (thread *)0x0) {
    if ((ptVar1->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar1,8);
  }
  (this->t)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

~WindowHandleData()
    {
#ifdef _WIN32
    if (w != 0 && h != 0)
      free(bytes);
#else      
    if (w != 0 && h != 0)
      free(bytes);

    if (display)
      {    
      XDestroyImage(im);
      XFreePixmap(display, pix);
      XCloseDisplay(display);
      }
#endif
    }